

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

void __thiscall Js::AsmJsModuleInfo::SetFunctionCount(AsmJsModuleInfo *this,int val)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  ModuleFunction *pMVar5;
  Type *addr;
  size_t size;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((this->mFunctions).ptr != (ModuleFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                ,0x66e,"(mFunctions == nullptr)","mFunctions == nullptr");
    if (!bVar2) goto LAB_00957af3;
    *puVar4 = 0;
  }
  this->mFunctionCount = val;
  local_50 = (undefined1  [8])&ModuleFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_46bf060;
  data.filename._0_4_ = 0x670;
  data.plusSize = (long)val;
  this_00 = Memory::Recycler::TrackAllocInfo(this->mRecycler,(TrackAllocData *)local_50);
  if (val == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pMVar5 = (ModuleFunction *)&DAT_00000008;
  }
  else {
    size = 0xffffffffffffffff;
    if (-1 < val) {
      size = (long)val * 4;
    }
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00957af3;
      *puVar4 = 0;
    }
    pMVar5 = (ModuleFunction *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (this_00,size);
    if (pMVar5 == (ModuleFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00957af3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  addr = &this->mFunctions;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pMVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void AsmJsModuleInfo::SetFunctionCount(int val)
    {
        Assert(mFunctions == nullptr);
        mFunctionCount = val;
        mFunctions = RecyclerNewArray(mRecycler, ModuleFunction, val);
    }